

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

size_t __thiscall V2Transport::GetMaxBytesToProcess(V2Transport *this)

{
  long lVar1;
  char *file;
  bool *val;
  size_type sVar2;
  ulong uVar3;
  long in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int line;
  char *in_stack_ffffffffffffffc0;
  bool *in_stack_ffffffffffffffc8;
  size_t local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(AnnotatedMixin<std::mutex> *)0x20ad64)
  ;
  line = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  switch(*(undefined1 *)(in_RDI + 0x518)) {
  case 0:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffffa8);
    inline_assertion_check<false,bool>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,line,in_stack_ffffffffffffffb0,
               (char *)in_stack_ffffffffffffffa8);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffffa8);
    local_18 = 0x10 - sVar2;
    break;
  case 1:
    file = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             (in_stack_ffffffffffffffa8);
    val = (bool *)EllSwiftPubKey::size();
    inline_assertion_check<false,bool>
              (val,file,line,in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    local_18 = EllSwiftPubKey::size();
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffffa8);
    local_18 = local_18 - sVar2;
    break;
  case 2:
    local_18 = 1;
    break;
  case 3:
  case 4:
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffffa8);
    if (sVar2 < 3) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (in_stack_ffffffffffffffa8);
      local_18 = 3 - sVar2;
    }
    else {
      uVar3 = (ulong)(*(int *)(in_RDI + 0x4c8) + 0x14);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (in_stack_ffffffffffffffa8);
      local_18 = uVar3 - sVar2;
    }
    break;
  case 5:
    local_18 = 0;
    break;
  case 6:
    inline_assertion_check<false,bool>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,line,in_stack_ffffffffffffffb0,
               (char *)in_stack_ffffffffffffffa8);
    local_18 = 0;
    break;
  default:
    inline_assertion_check<false,bool>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,line,in_stack_ffffffffffffffb0,
               (char *)in_stack_ffffffffffffffa8);
    local_18 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

size_t V2Transport::GetMaxBytesToProcess() noexcept
{
    AssertLockHeld(m_recv_mutex);
    switch (m_recv_state) {
    case RecvState::KEY_MAYBE_V1:
        // During the KEY_MAYBE_V1 state we do not allow more than the length of v1 prefix into the
        // receive buffer.
        Assume(m_recv_buffer.size() <= V1_PREFIX_LEN);
        // As long as we're not sure if this is a v1 or v2 connection, don't receive more than what
        // is strictly necessary to distinguish the two (16 bytes). If we permitted more than
        // the v1 header size (24 bytes), we may not be able to feed the already-received bytes
        // back into the m_v1_fallback V1 transport.
        return V1_PREFIX_LEN - m_recv_buffer.size();
    case RecvState::KEY:
        // During the KEY state, we only allow the 64-byte key into the receive buffer.
        Assume(m_recv_buffer.size() <= EllSwiftPubKey::size());
        // As long as we have not received the other side's public key, don't receive more than
        // that (64 bytes), as garbage follows, and locating the garbage terminator requires the
        // key exchange first.
        return EllSwiftPubKey::size() - m_recv_buffer.size();
    case RecvState::GARB_GARBTERM:
        // Process garbage bytes one by one (because terminator may appear anywhere).
        return 1;
    case RecvState::VERSION:
    case RecvState::APP:
        // These three states all involve decoding a packet. Process the length descriptor first,
        // so that we know where the current packet ends (and we don't process bytes from the next
        // packet or decoy yet). Then, process the ciphertext bytes of the current packet.
        if (m_recv_buffer.size() < BIP324Cipher::LENGTH_LEN) {
            return BIP324Cipher::LENGTH_LEN - m_recv_buffer.size();
        } else {
            // Note that BIP324Cipher::EXPANSION is the total difference between contents size
            // and encoded packet size, which includes the 3 bytes due to the packet length.
            // When transitioning from receiving the packet length to receiving its ciphertext,
            // the encrypted packet length is left in the receive buffer.
            return BIP324Cipher::EXPANSION + m_recv_len - m_recv_buffer.size();
        }
    case RecvState::APP_READY:
        // No bytes can be processed until GetMessage() is called.
        return 0;
    case RecvState::V1:
        // Not allowed (must be dealt with by the caller).
        Assume(false);
        return 0;
    }
    Assume(false); // unreachable
    return 0;
}